

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOStreamBuffer.h
# Opt level: O2

bool __thiscall
Assimp::IOStreamBuffer<char>::getNextDataLine
          (IOStreamBuffer<char> *this,vector<char,_std::allocator<char>_> *buffer,
          char continuationToken)

{
  pointer pcVar1;
  size_t sVar2;
  bool bVar3;
  byte bVar4;
  bool bVar5;
  ulong uVar6;
  size_t sVar7;
  long lVar8;
  
  std::vector<char,_std::allocator<char>_>::resize(buffer,this->m_cacheSize);
  if (((this->m_cachePos < this->m_cacheSize) && (this->m_filePos != 0)) ||
     (bVar3 = readNextBlock(this), bVar3)) {
    bVar3 = false;
    lVar8 = 0;
    do {
      pcVar1 = (this->m_cache).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar2 = this->m_cachePos;
      bVar4 = pcVar1[sVar2];
      sVar7 = sVar2;
      if (bVar4 == continuationToken) {
        sVar7 = sVar2 + 1;
        this->m_cachePos = sVar7;
        bVar4 = pcVar1[sVar2 + 1];
        bVar3 = true;
      }
      if ((bVar4 < 0xe) && ((0x3401U >> (bVar4 & 0x1f) & 1) != 0)) {
        if (!bVar3) goto LAB_00454ecb;
        do {
          sVar7 = sVar7 + 1;
          this->m_cachePos = sVar7;
          bVar3 = bVar4 != 10;
          bVar4 = pcVar1[sVar7];
        } while (bVar3);
        bVar3 = false;
      }
      (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_start[lVar8] = bVar4;
      uVar6 = this->m_cachePos + 1;
      this->m_cachePos = uVar6;
      lVar8 = lVar8 + 1;
      if (this->m_filesize <= uVar6) {
LAB_00454ecb:
        (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_start[lVar8] = '\n';
        this->m_cachePos = this->m_cachePos + 1;
        return true;
      }
    } while ((uVar6 < this->m_cacheSize) || (bVar5 = readNextBlock(this), bVar5));
  }
  return false;
}

Assistant:

AI_FORCE_INLINE
bool IOStreamBuffer<T>::getNextDataLine( std::vector<T> &buffer, T continuationToken ) {
    buffer.resize( m_cacheSize );
    if ( m_cachePos >= m_cacheSize || 0 == m_filePos ) {
        if ( !readNextBlock() ) {
            return false;
        }
    }

    bool continuationFound( false );
    size_t i = 0;
    for( ;; ) {
        if ( continuationToken == m_cache[ m_cachePos ] ) {
            continuationFound = true;
            ++m_cachePos;
        }
        if ( IsLineEnd( m_cache[ m_cachePos ] ) ) {
            if ( !continuationFound ) {
                // the end of the data line
                break;
            } else {
                // skip line end
                while ( m_cache[m_cachePos] != '\n') {
                    ++m_cachePos;
                }
                ++m_cachePos;
                continuationFound = false;
            }
        }

        buffer[ i ] = m_cache[ m_cachePos ];
        ++m_cachePos;
        ++i;
        if (m_cachePos >= size()) {
            break;
        }
        if ( m_cachePos >= m_cacheSize ) {
            if ( !readNextBlock() ) {
                return false;
            }
        }
    }
    
    buffer[ i ] = '\n';
    ++m_cachePos;

    return true;
}